

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

Bool prvTidyEntityInfo(ctmbstr name,Bool isXml,uint *code,uint *versions)

{
  entity *peVar1;
  char cVar2;
  uint in_EAX;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  entity *np;
  entity *peVar6;
  ctmbstr ptVar7;
  uint c;
  undefined8 uStack_38;
  
  if ((name == (ctmbstr)0x0) || (*name != '&')) {
    __assert_fail("name && name[0] == \'&\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/entities.c"
                  ,0x846,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (code == (uint *)0x0) {
    __assert_fail("code != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/entities.c"
                  ,0x847,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (versions == (uint *)0x0) {
    __assert_fail("versions != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/entities.c"
                  ,0x848,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  cVar2 = name[1];
  if (cVar2 != '\0') {
    if (cVar2 == '#') {
      uStack_38 = (ulong)in_EAX;
      if ((name[2] == 'x') || (name[2] == 'X' && isXml == no)) {
        ptVar7 = name + 3;
        pcVar5 = "%x";
      }
      else {
        ptVar7 = name + 2;
        pcVar5 = "%u";
      }
      iVar3 = __isoc99_sscanf(ptVar7,pcVar5,(long)&uStack_38 + 4);
      if (iVar3 != 1) {
        *code = 0;
        uVar4 = (uint)(isXml != no) * 0x2000 + 0xe000;
      }
      else {
        *code = uStack_38._4_4_;
        uVar4 = 0x61fff;
      }
      *versions = uVar4;
      return (uint)(iVar3 == 1);
    }
    peVar6 = entities;
    pcVar5 = "AElig";
    do {
      if (cVar2 == *pcVar5) break;
      pcVar5 = peVar6[1].name;
      peVar6 = peVar6 + 1;
    } while (pcVar5 != (char *)0x0);
    ptVar7 = peVar6->name;
    while ((ptVar7 != (ctmbstr)0x0 && (cVar2 == *ptVar7))) {
      iVar3 = prvTidytmbstrcmp(name + 1,ptVar7);
      if (iVar3 == 0) goto LAB_001413c8;
      peVar1 = peVar6 + 1;
      peVar6 = peVar6 + 1;
      ptVar7 = peVar1->name;
    }
  }
  peVar6 = (entity *)0x0;
LAB_001413c8:
  if (peVar6 == (entity *)0x0) {
    *code = 0;
    *versions = (uint)(isXml != no) * 0x2000 + 0xe000;
  }
  else {
    *code = peVar6->code;
    *versions = peVar6->versions;
  }
  return (uint)(peVar6 != (entity *)0x0);
}

Assistant:

Bool TY_(EntityInfo)( ctmbstr name, Bool isXml, uint* code, uint* versions )
{
    const entity* np;
    int res;
    assert( name && name[0] == '&' );
    assert( code != NULL );
    assert( versions != NULL );

    /* numeric entitity: name = "&#" followed by number */
    if ( name[1] == '#' )
    {
        uint c = 0;  /* zero on missing/bad number */

        /* 'x' prefix denotes hexadecimal number format */
        if ( name[2] == 'x' || (!isXml && name[2] == 'X') )
            res = sscanf( name+3, "%x", &c );
        else
            res = sscanf( name+2, "%u", &c );

        /*  Issue #373 - Null Char in XML result doc - sf905 2009 */
        if ( res == 1 )
        {
            *code = c;
            *versions = VERS_ALL;
            return yes;
        }
        else
        {
            *code = 0;
            *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
            return no;
        }
    }

    /* Named entity: name ="&" followed by a name */
    if ( NULL != (np = entitiesLookup(name+1)) )
    {
        *code = np->code;
        *versions = np->versions;
        return yes;
    }

    *code = 0;
    *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
    return no;
}